

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>>::
operator=(ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>> *this,
         ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *r)

{
  tree_node<immutable::vector<char,_false,_5>,_true> *ptVar1;
  internal_node<immutable::vector<char,_false,_5>,_true> *p_node;
  
  ptVar1 = r->ptr;
  if (ptVar1 != (tree_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
    LOCK();
    (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (ptVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  p_node = *(internal_node<immutable::vector<char,_false,_5>,_true> **)this;
  *(tree_node<immutable::vector<char,_false,_5>,_true> **)this = ptVar1;
  rrb_details::release<immutable::vector<char,false,5>>(p_node);
  return (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *)
         this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }